

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

int voc_count_diff(voccxdef *ctx,objnum *list,uint *flags,int *cnt,int keep_all)

{
  runsdef *prVar1;
  objnum oVar2;
  objnum oVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int local_54;
  
  local_54 = *cnt;
  if (0 < local_54) {
    lVar7 = 1;
    lVar5 = 0;
    do {
      runpprop(ctx->voccxrun,(uchar **)0x0,0,0,list[lVar5],0x2b,0,0,list[lVar5]);
      prVar1 = ctx->voccxrun->runcxsp;
      ctx->voccxrun->runcxsp = prVar1 + -1;
      if (prVar1[-1].runstyp == '\b') {
        oVar2 = objget1sc(ctx->voccxmem,list[lVar5]);
        if (oVar2 != 0xffff) {
          uVar8 = lVar5 + 1;
          lVar4 = lVar7;
          if ((long)uVar8 < (long)*cnt) {
            do {
              oVar3 = objget1sc(ctx->voccxmem,list[lVar4]);
              if ((oVar3 != oVar2) || (local_54 = local_54 + -1, keep_all != 0)) {
                iVar6 = (int)uVar8;
                list[iVar6] = list[lVar4];
                uVar8 = (ulong)(iVar6 + 1);
                flags[iVar6] = flags[lVar4];
              }
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 < *cnt);
          }
          iVar6 = (int)uVar8;
          *cnt = iVar6;
          list[iVar6] = 0xffff;
          flags[iVar6] = 0;
        }
      }
      else if (ctx->voccxrun->runcxsp->runstyp != '\x05') {
        ctx->voccxrun->runcxerr->errcxptr->erraac = 0;
        runsign(ctx->voccxrun,0x3ed);
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar5 < *cnt);
  }
  return local_54;
}

Assistant:

static int voc_count_diff(voccxdef *ctx, objnum *list, uint *flags, int *cnt,
                          int keep_all)
{
    int i;
    int diff_cnt;
    
    /* 
     *   Presume all items will be distinguishable from one another.  As
     *   we scan the list for indistinguishable items, we'll decrement
     *   this count each time we find an item that can't be distinguished
     *   from another item.  
     */
    diff_cnt = *cnt;

    /* 
     *   Look for indistinguishable items.
     *   
     *   An object is distinguishable if it doesn't have the special
     *   property marking it as one of a group of equivalent objects
     *   (PRP_ISEQUIV), or if it has the property but there is no object
     *   following it in the list which has the same immediate superclass.
     *   
     *   Note that we want to keep the duplicates if we're looking for
     *   plurals, because the player is explicitly referring to all
     *   matching objects.  
     */
    for (i = 0 ; i < *cnt ; ++i)
    {
        /* 
         *   check to see if this object might have indistinguishable
         *   duplicates - it must be marked with isEquiv for this to be
         *   possible 
         */
        runppr(ctx->voccxrun, list[i], PRP_ISEQUIV, 0);
        if (runpoplog(ctx->voccxrun))
        {
            int     j;
            int     dst;
            objnum  sc;
            
            /* get the superclass, if possible */
            sc = objget1sc(ctx->voccxmem, list[i]);
            if (sc == MCMONINV)
                continue;
            
            /* 
             *   run through the remainder of the list, and remove any
             *   duplicates of this item 
             */
            for (j = i + 1, dst = i + 1 ; j < *cnt ; ++j)
            {
                /* 
                 *   see if it matches our object - if not, keep it in the
                 *   list by copying it to our destination position 
                 */
                if (objget1sc(ctx->voccxmem, list[j]) != sc)
                {
                    /* it's distinguishable - keep it */
                    list[dst] = list[j];
                    flags[dst++] = flags[j];
                }
                else
                {
                    /*
                     *   This item is indistinguishable from the list[i].
                     *   First, reduce the count of different items.  
                     */
                    --diff_cnt;
                    
                    /*
                     *   Keep this object only if we're keeping all
                     *   redundant indistinguishable items. 
                     */
                    if (keep_all)
                    {
                        /* keep all items -> keep this item */
                        list[dst] = list[j];
                        flags[dst++] = flags[j];
                    }
                }
            }
            
            /* adjust the count to reflect the updated list */
            *cnt = dst;

            /* add a terminator */
            list[dst] = MCMONINV;
            flags[dst] = 0;
        }
    }

    /* return the number of distinguishable items */
    return diff_cnt;
}